

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O1

bool __thiscall
chrono::ChFunction_Sequence::HandleAccess
          (ChFunction_Sequence *this,int handle_id,double mx,double my,bool set_mode)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  if (handle_id == 0) {
    if (set_mode) {
      this->start = mx;
    }
  }
  else {
    p_Var2 = (_List_node_base *)&this->functions;
    do {
      p_Var2 = (((_List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *)
                &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var2 == (_List_node_base *)&this->functions) {
        return false;
      }
    } while (handle_id != 1);
    if (set_mode) {
      p_Var2[3]._M_prev = (_List_node_base *)mx;
      p_Var1 = p_Var2[3]._M_next;
      if (mx < (double)p_Var1) {
        p_Var2[3]._M_prev = p_Var1;
      }
      *(double *)(p_Var2 + 1 + 1) = (double)p_Var2[3]._M_prev - (double)p_Var1;
      Setup(this);
    }
  }
  return true;
}

Assistant:

bool ChFunction_Sequence::HandleAccess(int handle_id, double mx, double my, bool set_mode) {
    if (handle_id == 0) {
        if (!set_mode)
            mx = Get_start();
        else
            Set_start(mx);
        return true;
    }
    int tot = 1;
    for (auto iter = functions.begin(); iter != functions.end(); ++iter) {
        if (handle_id == tot) {
            if (!set_mode)
                mx = iter->t_end;
            else {
                iter->SetTend(mx);
                Setup();
            }
            return true;
        }
    }

    return false;
}